

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O2

void __thiscall QStyleOptionProgressBar::QStyleOptionProgressBar(QStyleOptionProgressBar *this)

{
  QStyleOptionProgressBar(this,1);
  return;
}

Assistant:

QStyleOptionProgressBar::QStyleOptionProgressBar()
    : QStyleOptionProgressBar(QStyleOptionProgressBar::Version)
{
}